

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visit.c
# Opt level: O1

int json_c_visit(json_object *jso,int future_flags,json_c_visit_userfunc *userfunc,void *userarg)

{
  int iVar1;
  
  iVar1 = _json_c_visit(jso,(json_object *)0x0,(char *)0x0,(size_t *)0x0,userfunc,userarg);
  if (iVar1 < 0x1d7b) {
    if (iVar1 == 0) {
      return 0;
    }
    if (iVar1 == 0x2ff) {
      return 0;
    }
  }
  else {
    if (iVar1 == 0x1d7b) {
      return 0;
    }
    if (iVar1 == 0x1ebb) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int json_c_visit(json_object *jso, int future_flags, json_c_visit_userfunc *userfunc, void *userarg)
{
	int ret = _json_c_visit(jso, NULL, NULL, NULL, userfunc, userarg);
	switch (ret)
	{
	case JSON_C_VISIT_RETURN_CONTINUE:
	case JSON_C_VISIT_RETURN_SKIP:
	case JSON_C_VISIT_RETURN_POP:
	case JSON_C_VISIT_RETURN_STOP: return 0;
	default: return JSON_C_VISIT_RETURN_ERROR;
	}
}